

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void xy_x_4tap_32_avx2(uint8_t *src,__m256i *coeffs,__m256i *filt,int16_t *dst)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar3 = vpshufb_avx2(*(undefined1 (*) [32])src,(undefined1  [32])*filt);
  auVar1 = vpshufb_avx2(*(undefined1 (*) [32])src,(undefined1  [32])filt[1]);
  auVar3 = vpmaddubsw_avx2(auVar3,(undefined1  [32])*coeffs);
  auVar1 = vpmaddubsw_avx2(auVar1,(undefined1  [32])coeffs[1]);
  auVar3 = vpaddw_avx2(auVar3,auVar1);
  auVar1 = vpshufb_avx2(*(undefined1 (*) [32])(src + 8),(undefined1  [32])*filt);
  auVar2 = vpshufb_avx2(*(undefined1 (*) [32])(src + 8),(undefined1  [32])filt[1]);
  auVar1 = vpmaddubsw_avx2(auVar1,(undefined1  [32])*coeffs);
  auVar2 = vpmaddubsw_avx2(auVar2,(undefined1  [32])coeffs[1]);
  auVar1 = vpaddw_avx2(auVar1,auVar2);
  auVar4._8_2_ = 2;
  auVar4._0_8_ = 0x2000200020002;
  auVar4._10_2_ = 2;
  auVar4._12_2_ = 2;
  auVar4._14_2_ = 2;
  auVar4._16_2_ = 2;
  auVar4._18_2_ = 2;
  auVar4._20_2_ = 2;
  auVar4._22_2_ = 2;
  auVar4._24_2_ = 2;
  auVar4._26_2_ = 2;
  auVar4._28_2_ = 2;
  auVar4._30_2_ = 2;
  auVar3 = vpaddw_avx2(auVar3,auVar4);
  auVar2 = vpsraw_avx2(auVar3,2);
  auVar3 = vpaddw_avx2(auVar1,auVar4);
  auVar3 = vpsraw_avx2(auVar3,2);
  *(undefined1 (*) [32])dst = auVar2;
  *(undefined1 (*) [32])(dst + 0x10) = auVar3;
  return;
}

Assistant:

static inline void xy_x_4tap_32_avx2(const uint8_t *const src,
                                     const __m256i coeffs[2],
                                     const __m256i filt[2],
                                     int16_t *const dst) {
  __m256i r[2];

  x_convolve_4tap_32_avx2(src, coeffs, filt, r);
  const __m256i d0 = xy_x_round_avx2(r[0]);
  const __m256i d1 = xy_x_round_avx2(r[1]);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}